

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O3

void writeGlpsolCostRow(FILE *file,HighsLogOptions *log_options,bool raw,bool is_mip,HighsInt row_id
                       ,string *objective_name,double objective_function_value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  char *pcVar3;
  array<char,_32UL> double_string;
  stringstream ss;
  string local_208;
  double local_1e8;
  HighsLogOptions *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e8 = objective_function_value;
  local_1e0 = log_options;
  std::__cxx11::stringstream::stringstream(local_1b8);
  paVar1 = &local_208.field_2;
  local_208._M_string_length = 0;
  local_208.field_2._M_local_buf[0] = '\0';
  local_208._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if (raw) {
    highsDoubleToString((array<char,_32UL> *)&local_208,local_1e8,1e-12);
    pcVar2 = "b ";
    if (is_mip) {
      pcVar2 = "";
    }
    pcVar3 = " 0";
    if (is_mip) {
      pcVar3 = "";
    }
    highsFormatToString_abi_cxx11_
              (&local_1d8,"i %d %s%s%s\n",(ulong)(uint)row_id,pcVar2,&local_208,pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) goto LAB_0024da3a;
  }
  else {
    highsFormatToString_abi_cxx11_(&local_208,"%6d ",(ulong)(uint)row_id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    if (objective_name->_M_string_length < 0xd) {
      highsFormatToString_abi_cxx11_(&local_208,"%-12s ",(objective_name->_M_dataplus)._M_p);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    }
    else {
      highsFormatToString_abi_cxx11_(&local_208,"%s\n%20s",(objective_name->_M_dataplus)._M_p,"");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    if (is_mip) {
      highsFormatToString_abi_cxx11_(&local_208,"   ");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    }
    else {
      highsFormatToString_abi_cxx11_(&local_208,"B  ");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    highsFormatToString_abi_cxx11_(&local_208,"%13.6g %13s %13s \n",local_1e8,"");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    local_1d8._M_dataplus._M_p = local_208._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p == paVar1) goto LAB_0024da3a;
  }
  operator_delete(local_1d8._M_dataplus._M_p);
LAB_0024da3a:
  std::__cxx11::stringbuf::str();
  highsFprintfString(file,local_1e0,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void writeGlpsolCostRow(FILE* file, const HighsLogOptions& log_options,
                        const bool raw, const bool is_mip,
                        const HighsInt row_id, const std::string objective_name,
                        const double objective_function_value) {
  std::stringstream ss;
  ss.str(std::string());
  if (raw) {
    double double_value = objective_function_value;
    auto double_string = highsDoubleToString(
        double_value, kGlpsolSolutionValueToStringTolerance);
    // Last term of 0 for dual should (also) be blank when not MIP
    ss << highsFormatToString("i %d %s%s%s\n", (int)row_id, is_mip ? "" : "b ",
                              double_string.data(), is_mip ? "" : " 0");
  } else {
    ss << highsFormatToString("%6d ", (int)row_id);
    if (objective_name.length() <= 12) {
      ss << highsFormatToString("%-12s ", objective_name.c_str());
    } else {
      ss << highsFormatToString("%s\n%20s", objective_name.c_str(), "");
    }
    if (is_mip) {
      ss << highsFormatToString("   ");
    } else {
      ss << highsFormatToString("B  ");
    }
    ss << highsFormatToString("%13.6g %13s %13s \n", objective_function_value,
                              "", "");
  }
  highsFprintfString(file, log_options, ss.str());
}